

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O2

FRAME_CODEC_HANDLE
frame_codec_create(ON_FRAME_CODEC_ERROR on_frame_codec_error,void *callback_context)

{
  int iVar1;
  FRAME_CODEC_HANDLE pFVar2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  
  if (on_frame_codec_error == (ON_FRAME_CODEC_ERROR)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (FRAME_CODEC_HANDLE)0x0;
    }
    pcVar5 = "NULL on_frame_codec_error";
    iVar1 = 0x54;
  }
  else {
    pFVar2 = (FRAME_CODEC_HANDLE)calloc(1,0x50);
    if (pFVar2 != (FRAME_CODEC_HANDLE)0x0) {
      pFVar2->on_frame_codec_error = on_frame_codec_error;
      pFVar2->on_frame_codec_error_callback_context = callback_context;
      pSVar3 = singlylinkedlist_create();
      pFVar2->subscription_list = pSVar3;
      pFVar2->max_frame_size = 0x200;
      return pFVar2;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (FRAME_CODEC_HANDLE)0x0;
    }
    pcVar5 = "Could not allocate frame codec";
    iVar1 = 0x5d;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
            ,"frame_codec_create",iVar1,1,pcVar5);
  return (FRAME_CODEC_HANDLE)0x0;
}

Assistant:

FRAME_CODEC_HANDLE frame_codec_create(ON_FRAME_CODEC_ERROR on_frame_codec_error, void* callback_context)
{
    FRAME_CODEC_INSTANCE* result;

    /* Codes_SRS_FRAME_CODEC_01_020: [If the on_frame_codec_error argument is NULL, frame_codec_create shall return NULL.] */
    /* Codes_SRS_FRAME_CODEC_01_104: [The callback_context shall be allowed to be NULL.] */
    if (on_frame_codec_error == NULL)
    {
        LogError("NULL on_frame_codec_error");
        result = NULL;
    }
    else
    {
        result = (FRAME_CODEC_INSTANCE*)calloc(1, sizeof(FRAME_CODEC_INSTANCE));
        /* Codes_SRS_FRAME_CODEC_01_022: [If allocating memory for the frame_codec instance fails, frame_codec_create shall return NULL.] */
        if (result == NULL)
        {
            LogError("Could not allocate frame codec");
        }
        else
        {
            /* Codes_SRS_FRAME_CODEC_01_021: [frame_codec_create shall create a new instance of frame_codec and return a non-NULL handle to it on success.] */
            result->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_SIZE;
            result->on_frame_codec_error = on_frame_codec_error;
            result->on_frame_codec_error_callback_context = callback_context;
            result->receive_frame_pos = 0;
            result->receive_frame_size = 0;
            result->receive_frame_malloc_size = 0;
            result->receive_frame_bytes = NULL;
            result->subscription_list = singlylinkedlist_create();

            /* Codes_SRS_FRAME_CODEC_01_082: [The initial max_frame_size_shall be 512.] */
            result->max_frame_size = 512;
        }
    }

    return result;
}